

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tools_common.c
# Opt level: O3

size_t buffer_input(AvxInputContext *input_ctx,size_t n,uchar *buf,_Bool buffered)

{
  size_t sVar1;
  undefined3 in_register_00000009;
  
  if (CONCAT31(in_register_00000009,buffered) != 0) {
    sVar1 = input_to_detect_buf(input_ctx,n);
    if (sVar1 < n) {
      return sVar1;
    }
  }
  sVar1 = read_from_input(input_ctx,n,buf);
  return sVar1;
}

Assistant:

size_t buffer_input(struct AvxInputContext *input_ctx, size_t n,
                    unsigned char *buf, bool buffered) {
  if (!buffered) {
    return read_from_input(input_ctx, n, buf);
  }
  const size_t buf_n = input_to_detect_buf(input_ctx, n);
  if (buf_n < n) {
    return buf_n;
  }
  return read_from_input(input_ctx, n, buf);
}